

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O3

void null_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                 JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  bool bVar4;
  JSAMPROW pJVar5;
  ulong uVar6;
  long lVar7;
  
  if (0 < num_rows) {
    JVar1 = cinfo->output_width;
    uVar2 = cinfo->num_components;
    do {
      if (0 < (int)uVar2) {
        uVar6 = 0;
        do {
          if (JVar1 != 0) {
            pJVar5 = *output_buf + uVar6;
            pJVar3 = input_buf[uVar6][input_row];
            lVar7 = 0;
            do {
              *pJVar5 = pJVar3[lVar7];
              pJVar5 = pJVar5 + (int)uVar2;
              lVar7 = lVar7 + 1;
            } while (JVar1 != (JDIMENSION)lVar7);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar2);
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
      bVar4 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_decompress_ptr cinfo,
	      JSAMPIMAGE input_buf, JDIMENSION input_row,
	      JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, outptr;
  register JDIMENSION count;
  register int num_components = cinfo->num_components;
  JDIMENSION num_cols = cinfo->output_width;
  int ci;

  while (--num_rows >= 0) {
    for (ci = 0; ci < num_components; ci++) {
      inptr = input_buf[ci][input_row];
      outptr = output_buf[0] + ci;
      for (count = num_cols; count > 0; count--) {
	*outptr = *inptr++;	/* needn't bother with GETJSAMPLE() here */
	outptr += num_components;
      }
    }
    input_row++;
    output_buf++;
  }
}